

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccumulatorView.hpp
# Opt level: O3

void __thiscall
OpenMD::Utils::
AccumulatorView<OpenMD::Utils::Accumulator<std::vector<double,_std::allocator<double>_>_>_>::
writeErrorBars(AccumulatorView<OpenMD::Utils::Accumulator<std::vector<double,_std::allocator<double>_>_>_>
               *this,ostream *stream,string *errorMessage,ErrorHandling errorHandling)

{
  StdVectorAccumulator *this_00;
  size_t sVar1;
  pointer pdVar2;
  pointer pdVar3;
  int i;
  ulong uVar4;
  pointer local_68;
  pointer local_60;
  vector<double,_std::allocator<double>_> local_50;
  string *local_38;
  
  this_00 = &this->super_StdVectorAccumulator;
  sVar1 = (this->super_StdVectorAccumulator).Count_;
  local_38 = errorMessage;
  if (errorHandling == Variance) {
    Accumulator<std::vector<double,_std::allocator<double>_>_>::getVariance(&local_50,this_00);
  }
  else if (errorHandling == StdDev) {
    Accumulator<std::vector<double,_std::allocator<double>_>_>::getStdDev(&local_50,this_00);
  }
  else {
    if (errorHandling != CI95) {
      local_68 = (pointer)0x0;
      local_60 = (pointer)0x0;
      goto LAB_00231057;
    }
    Accumulator<std::vector<double,_std::allocator<double>_>_>::get95percentConfidenceInterval
              (&local_50,this_00);
  }
  local_68 = local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_60 = local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
LAB_00231057:
  uVar4 = 0;
  do {
    std::vector<double,_std::allocator<double>_>::vector
              (&local_50,&(this->super_StdVectorAccumulator).Avg_);
    pdVar3 = local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar2 = local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((ulong)((long)pdVar3 - (long)pdVar2 >> 3) <= uVar4) {
      if (local_68 != (pointer)0x0) {
        operator_delete(local_68,(long)local_60 - (long)local_68);
      }
      return;
    }
    if (errorHandling == CI95 && sVar1 == 0) {
LAB_002310b1:
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\t",1);
    }
    else if ((ulong)ABS(local_68[uVar4]) < 0x7ff0000000000000) {
      if (sVar1 == 0) goto LAB_002310b1;
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\t",1);
      std::ostream::_M_insert<double>(local_68[uVar4]);
    }
    else {
      snprintf(painCave.errMsg,2000,"%s",(local_38->_M_dataplus)._M_p);
      painCave.isFatal = 1;
      simError();
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void writeErrorBars(std::ostream& stream, const std::string& errorMessage,
                        ErrorHandling errorHandling) const override {
      std::vector<RealType> err;
      std::size_t count = StdVectorAccumulator::getCount();

      switch (errorHandling) {
      case ErrorHandling::CI95:
        err = StdVectorAccumulator::get95percentConfidenceInterval();
        break;
      case ErrorHandling::StdDev:
        err = StdVectorAccumulator::getStdDev();
        break;
      case ErrorHandling::Variance:
        err = StdVectorAccumulator::getVariance();
        break;
      default:
        break;
      }

      for (int i = 0; i < StdVectorAccumulator::getAverage().size(); i++) {
        if (count == 0 && errorHandling == ErrorHandling::CI95) {
          stream << "\t";
        } else {
          if (std::isinf(err[i]) || std::isnan(err[i])) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "%s",
                     errorMessage.c_str());
            painCave.isFatal = 1;
            simError();
          } else {
            if (count == 0)
              stream << "\t";
            else
              stream << "\t" << err[i];
          }
        }
      }
    }